

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O1

Matrix * operator+(Matrix *__return_storage_ptr__,Matrix *m0,Matrix *m1)

{
  Matrix *this;
  long *plVar1;
  long *plVar2;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  this = (Matrix *)operator_new(0x100);
  Matrix::Matrix(this,m0);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70," + ","");
  plVar1 = (long *)std::__cxx11::string::replace
                             ((ulong)local_70,0,(char *)0x0,
                              (ulong)(m0->sMatrixName)._M_dataplus._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_80 = *plVar2;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar2;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(m1->sMatrixName)._M_dataplus._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_40 = *plVar2;
    lStack_38 = plVar1[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar2;
    local_50 = (long *)*plVar1;
  }
  local_48 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->sMatrixName,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  Matrix::operator+=(this,m1);
  Matrix::Matrix(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Matrix operator+(const Matrix &m0, const Matrix &m1)
{
	Matrix *m = new Matrix(m0);
	m->sMatrixName = m0.sMatrixName + string(" + ") + m1.sMatrixName;
	return m->operator+=( m1 );
}